

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::changeMaxObj(SPxLPBase<double> *this,int i,double *newVal,bool scale)

{
  double dVar1;
  double *pdVar2;
  byte in_CL;
  double *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  LPColSetBase<double> *this_00;
  undefined8 in_stack_ffffffffffffffc8;
  LPColSetBase<double> *in_stack_ffffffffffffffd0;
  
  if ((in_CL & 1) == 0) {
    dVar1 = *in_RDX;
    pdVar2 = LPColSetBase<double>::maxObj_w(in_stack_ffffffffffffffd0,(int)((ulong)dVar1 >> 0x20));
    *pdVar2 = dVar1;
  }
  else {
    this_00 = (LPColSetBase<double> *)
              (**(code **)(**(long **)(in_RDI + 0x1a8) + 0x148))
                        (*in_RDX,*(long **)(in_RDI + 0x1a8),in_RDI,in_ESI);
    pdVar2 = LPColSetBase<double>::maxObj_w(this_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20))
    ;
    *pdVar2 = (double)this_00;
  }
  return;
}

Assistant:

virtual void changeMaxObj(int i, const R& newVal, bool scale = false)
   {
      if(scale)
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPColSetBase<R>::maxObj_w(i) = lp_scaler->scaleObj(*this, i, newVal);
      }
      else
         LPColSetBase<R>::maxObj_w(i) = newVal;

      assert(isConsistent());
   }